

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_thread_create_ex(uv_thread_t *tid,uv_thread_options_t *params,_func_void_void_ptr *entry,
                       void *arg)

{
  int iVar1;
  size_t sVar2;
  pthread_attr_t *__attr;
  size_t sVar3;
  pthread_attr_t attr_storage;
  pthread_attr_t local_60;
  
  if (((params->flags & 1) == 0) || (sVar3 = params->stack_size, sVar3 == 0)) {
    sVar3 = uv__thread_stack_size();
  }
  else {
    iVar1 = getpagesize();
    sVar3 = -(long)iVar1 & (sVar3 + (long)iVar1) - 1;
    sVar2 = uv__min_stack_size();
    if (sVar3 <= sVar2) {
      sVar3 = sVar2;
    }
  }
  if (sVar3 == 0) {
    __attr = (pthread_attr_t *)0x0;
  }
  else {
    __attr = &local_60;
    iVar1 = pthread_attr_init(__attr);
    if ((iVar1 != 0) || (iVar1 = pthread_attr_setstacksize(__attr,sVar3), iVar1 != 0)) {
      abort();
    }
  }
  iVar1 = pthread_create(tid,__attr,(__start_routine *)entry,arg);
  if (__attr != (pthread_attr_t *)0x0) {
    pthread_attr_destroy(__attr);
  }
  return -iVar1;
}

Assistant:

int uv_thread_create_ex(uv_thread_t* tid,
                        const uv_thread_options_t* params,
                        void (*entry)(void *arg),
                        void *arg) {
  int err;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;
  size_t pagesize;
  size_t stack_size;
  size_t min_stack_size;

  /* Used to squelch a -Wcast-function-type warning. */
  union {
    void (*in)(void*);
    void* (*out)(void*);
  } f;

  stack_size =
      params->flags & UV_THREAD_HAS_STACK_SIZE ? params->stack_size : 0;

  attr = NULL;
  if (stack_size == 0) {
    stack_size = uv__thread_stack_size();
  } else {
    pagesize = (size_t)getpagesize();
    /* Round up to the nearest page boundary. */
    stack_size = (stack_size + pagesize - 1) &~ (pagesize - 1);
    min_stack_size = uv__min_stack_size();
    if (stack_size < min_stack_size)
      stack_size = min_stack_size;
  }

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  f.in = entry;
  err = pthread_create(tid, attr, f.out, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}